

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O2

void __thiscall
llvm::SMDiagnostic::print
          (SMDiagnostic *this,char *ProgName,raw_ostream *OS,bool ShowColors,bool ShowKindLabel)

{
  string *psVar1;
  undefined8 *puVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  size_type sVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  StringRef LineContents;
  _Alloc_hider _Var11;
  undefined8 uVar12;
  bool bVar13;
  uint uVar14;
  const_iterator cVar15;
  size_type sVar16;
  bool DisableColors;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  undefined1 DisableColors_00;
  size_t i;
  ulong uVar20;
  long lVar21;
  size_t OutCol;
  ulong uVar22;
  pointer pcVar23;
  StringRef Chars;
  size_type *local_b0;
  string FixItInsertionLine;
  undefined1 auStack_78 [8];
  WithColor S_1;
  pointer local_60;
  undefined1 local_50 [8];
  string CaretLine;
  
  DisableColors = !ShowColors;
  DisableColors_00 = 0;
  uVar14 = (uint)DisableColors;
  WithColor::WithColor((WithColor *)local_50,OS,SAVEDCOLOR,true,false,DisableColors);
  if ((ProgName != (char *)0x0) && (*ProgName != '\0')) {
    raw_ostream::operator<<((raw_ostream *)local_50,ProgName);
    raw_ostream::operator<<((raw_ostream *)local_50,": ");
  }
  if ((this->Filename)._M_string_length != 0) {
    bVar13 = std::operator==(&this->Filename,"-");
    if (bVar13) {
      raw_ostream::operator<<((raw_ostream *)local_50,"<stdin>");
    }
    else {
      raw_ostream::operator<<((raw_ostream *)local_50,&this->Filename);
    }
    if (this->LineNo != -1) {
      raw_ostream::operator<<((raw_ostream *)local_50,':');
      WithColor::operator<<((WithColor *)local_50,&this->LineNo);
      if (this->ColumnNo != -1) {
        raw_ostream::operator<<((raw_ostream *)local_50,':');
        raw_ostream::operator<<((raw_ostream *)local_50,this->ColumnNo + 1);
      }
    }
    raw_ostream::operator<<((raw_ostream *)local_50,": ");
  }
  WithColor::~WithColor((WithColor *)local_50);
  if (ShowKindLabel) {
    switch(this->Kind) {
    case DK_Error:
      WithColor::error((WithColor *)OS,(raw_ostream *)0xe8c7d2,(StringRef)(ZEXT416(uVar14) << 0x40),
                       (bool)DisableColors_00);
      break;
    case DK_Warning:
      WithColor::warning((WithColor *)OS,(raw_ostream *)0xe8c7d2,
                         (StringRef)(ZEXT416(uVar14) << 0x40),(bool)DisableColors_00);
      break;
    case DK_Remark:
      WithColor::remark((WithColor *)OS,(raw_ostream *)0xe8c7d2,(StringRef)(ZEXT416(uVar14) << 0x40)
                        ,(bool)DisableColors_00);
      break;
    case DK_Note:
      WithColor::note((WithColor *)OS,(raw_ostream *)0xe8c7d2,(StringRef)(ZEXT416(uVar14) << 0x40),
                      (bool)DisableColors_00);
    }
  }
  WithColor::WithColor((WithColor *)local_50,OS,SAVEDCOLOR,true,false,DisableColors);
  raw_ostream::operator<<((raw_ostream *)local_50,&this->Message);
  raw_ostream::operator<<((raw_ostream *)local_50,'\n');
  WithColor::~WithColor((WithColor *)local_50);
  if ((this->LineNo != -1) && (this->ColumnNo != -1)) {
    cVar15 = find_if<std::__cxx11::string_const&,bool(*)(char)>(&this->LineContents,isNonASCII);
    psVar1 = &this->LineContents;
    uVar22 = (this->LineContents)._M_string_length;
    LineContents.Data = (psVar1->_M_dataplus)._M_p;
    LineContents.Length = psVar1->_M_string_length;
    if (cVar15._M_current == (psVar1->_M_dataplus)._M_p + uVar22) {
      local_50 = (undefined1  [8])&CaretLine._M_string_length;
      FixItInsertionLine.field_2._8_8_ = &this->LineContents;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar22 + '\x01');
      ppVar3 = (this->Ranges).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar4 = (this->Ranges).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar20 = 0; ((ulong)((long)ppVar3 - (long)ppVar4) >> 3 & 0xffffffff) != uVar20;
          uVar20 = uVar20 + 1) {
        ppVar5 = (this->Ranges).
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar19 = (ulong)ppVar5[uVar20].first;
        uVar17 = (ulong)ppVar5[uVar20].second;
        if (CONCAT44(CaretLine._M_dataplus._M_p._4_4_,(uint)CaretLine._M_dataplus._M_p) < uVar17) {
          uVar17 = CONCAT44(CaretLine._M_dataplus._M_p._4_4_,(uint)CaretLine._M_dataplus._M_p);
        }
        sVar18 = uVar17 - uVar19;
        if (sVar18 != 0) {
          memset((void *)((long)(_func_int ***)local_50 + uVar19),0x7e,sVar18);
        }
      }
      local_b0 = &FixItInsertionLine._M_string_length;
      FixItInsertionLine._M_dataplus._M_p = (pointer)0x0;
      FixItInsertionLine._M_string_length._0_1_ = 0;
      uVar20 = (ulong)(this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
                      super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
                      super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.
                      Size;
      uVar14 = this->ColumnNo;
      S_1._8_8_ = this;
      if (uVar20 != 0) {
        sVar6 = (this->LineContents)._M_string_length;
        uVar19 = (long)(this->Loc).Ptr - (long)(int)uVar14;
        pvVar7 = (this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
                 super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
                 super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
        uVar17 = uVar19 + sVar6;
        local_60 = (pointer)0x0;
        for (lVar21 = 0; uVar20 * 0x30 != lVar21; lVar21 = lVar21 + 0x30) {
          puVar2 = (undefined8 *)((long)pvVar7 + lVar21 + 0x10);
          auStack_78 = (undefined1  [8])*puVar2;
          S_1.OS = (raw_ostream *)puVar2[1];
          Chars.Length = 3;
          Chars.Data = "\n\r\t";
          sVar16 = StringRef::find_first_of((StringRef *)auStack_78,Chars,0);
          if (sVar16 == 0xffffffffffffffff) {
            uVar8 = *(ulong *)((long)pvVar7 + lVar21);
            uVar9 = *(ulong *)((long)pvVar7 + lVar21 + 8);
            if (uVar19 <= uVar9 && uVar8 <= uVar17) {
              uVar14 = (int)uVar8 - (int)uVar19;
              if (uVar8 < uVar19) {
                uVar14 = 0;
              }
              pcVar23 = (pointer)(ulong)uVar14;
              uVar10 = (int)local_60 + 1;
              if (local_60 <= pcVar23) {
                uVar10 = uVar14;
              }
              sVar18 = *(size_t *)((long)pvVar7 + lVar21 + 0x18);
              uVar14 = (int)sVar18 + uVar10;
              local_60 = (pointer)(ulong)uVar14;
              if (FixItInsertionLine._M_dataplus._M_p < local_60) {
                std::__cxx11::string::resize((ulong)&local_b0,(char)uVar14);
                sVar18 = *(size_t *)((long)pvVar7 + lVar21 + 0x18);
              }
              if (sVar18 != 0) {
                memmove((void *)((ulong)uVar10 + (long)local_b0),
                        *(void **)((long)pvVar7 + lVar21 + 0x10),sVar18);
              }
              uVar14 = (int)uVar9 - (int)uVar19;
              if (uVar17 <= uVar9) {
                uVar14 = (uint)sVar6;
              }
              if ((ulong)uVar14 - (long)pcVar23 != 0) {
                memset(pcVar23 + (long)(_func_int ***)local_50,0x7e,(ulong)uVar14 - (long)pcVar23);
              }
            }
          }
        }
        uVar14 = *(uint *)(S_1._8_8_ + 0x34);
      }
      uVar12 = S_1._8_8_;
      uVar20 = (long)(int)uVar14;
      if (uVar22 < uVar14) {
        uVar20 = uVar22;
      }
      *(undefined1 *)((long)(_func_int ***)local_50 + uVar20) = 0x5e;
      lVar21 = std::__cxx11::string::find_last_not_of((char)local_50,0x20);
      std::__cxx11::string::erase((ulong)local_50,lVar21 + 1);
      printSourceLine(OS,*(StringRef *)(uVar12 + 0x60));
      uVar14 = 0;
      WithColor::WithColor((WithColor *)auStack_78,OS,GREEN,true,false,DisableColors);
      for (uVar22 = 0; uVar22 != (uint)CaretLine._M_dataplus._M_p; uVar22 = uVar22 + 1) {
        if ((uVar22 < *(ulong *)(S_1._8_8_ + 0x68)) &&
           (*(char *)(*(long *)FixItInsertionLine.field_2._8_8_ + uVar22) == '\t')) {
          do {
            WithColor::operator<<
                      ((WithColor *)auStack_78,(char *)((long)(_func_int ***)local_50 + uVar22));
            uVar14 = uVar14 + 1;
          } while ((uVar14 & 7) != 0);
        }
        else {
          WithColor::operator<<
                    ((WithColor *)auStack_78,(char *)((long)(_func_int ***)local_50 + uVar22));
          uVar14 = uVar14 + 1;
        }
      }
      raw_ostream::operator<<((raw_ostream *)auStack_78,'\n');
      WithColor::~WithColor((WithColor *)auStack_78);
      _Var11 = FixItInsertionLine._M_dataplus;
      if (FixItInsertionLine._M_dataplus._M_p != (pointer)0x0) {
        uVar22 = 0;
        for (pcVar23 = (pointer)0x0; pcVar23 < _Var11._M_p; pcVar23 = pcVar23 + 1) {
          if ((pcVar23 < *(pointer *)(S_1._8_8_ + 0x68)) &&
             (pcVar23[*(long *)FixItInsertionLine.field_2._8_8_] == '\t')) {
            do {
              raw_ostream::operator<<(OS,*(char *)((long)local_b0 + (long)pcVar23));
              pcVar23 = pcVar23 + (*(char *)((long)local_b0 + (long)pcVar23) != ' ');
              uVar22 = uVar22 + 1;
              if ((uVar22 & 7) == 0) break;
            } while (pcVar23 != _Var11._M_p);
          }
          else {
            raw_ostream::operator<<(OS,*(char *)((long)local_b0 + (long)pcVar23));
            uVar22 = uVar22 + 1;
          }
        }
        raw_ostream::operator<<(OS,'\n');
      }
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)local_50);
    }
    else {
      printSourceLine(OS,LineContents);
    }
  }
  return;
}

Assistant:

void SMDiagnostic::print(const char *ProgName, raw_ostream &OS,
                         bool ShowColors, bool ShowKindLabel) const {
  {
    WithColor S(OS, raw_ostream::SAVEDCOLOR, true, false, !ShowColors);

    if (ProgName && ProgName[0])
      S << ProgName << ": ";

    if (!Filename.empty()) {
      if (Filename == "-")
        S << "<stdin>";
      else
        S << Filename;

      if (LineNo != -1) {
        S << ':' << LineNo;
        if (ColumnNo != -1)
          S << ':' << (ColumnNo + 1);
      }
      S << ": ";
    }
  }

  if (ShowKindLabel) {
    switch (Kind) {
    case SourceMgr::DK_Error:
      WithColor::error(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Warning:
      WithColor::warning(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Note:
      WithColor::note(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Remark:
      WithColor::remark(OS, "", !ShowColors);
      break;
    }
  }

  WithColor(OS, raw_ostream::SAVEDCOLOR, true, false, !ShowColors)
      << Message << '\n';

  if (LineNo == -1 || ColumnNo == -1)
    return;

  // FIXME: If there are multibyte or multi-column characters in the source, all
  // our ranges will be wrong. To do this properly, we'll need a byte-to-column
  // map like Clang's TextDiagnostic. For now, we'll just handle tabs by
  // expanding them later, and bail out rather than show incorrect ranges and
  // misaligned fixits for any other odd characters.
  if (find_if(LineContents, isNonASCII) != LineContents.end()) {
    printSourceLine(OS, LineContents);
    return;
  }
  size_t NumColumns = LineContents.size();

  // Build the line with the caret and ranges.
  std::string CaretLine(NumColumns+1, ' ');

  // Expand any ranges.
  for (unsigned r = 0, e = Ranges.size(); r != e; ++r) {
    std::pair<unsigned, unsigned> R = Ranges[r];
    std::fill(&CaretLine[R.first],
              &CaretLine[std::min((size_t)R.second, CaretLine.size())],
              '~');
  }

  // Add any fix-its.
  // FIXME: Find the beginning of the line properly for multibyte characters.
  std::string FixItInsertionLine;
  buildFixItLine(CaretLine, FixItInsertionLine, FixIts,
                 makeArrayRef(Loc.getPointer() - ColumnNo,
                              LineContents.size()));

  // Finally, plop on the caret.
  if (unsigned(ColumnNo) <= NumColumns)
    CaretLine[ColumnNo] = '^';
  else
    CaretLine[NumColumns] = '^';

  // ... and remove trailing whitespace so the output doesn't wrap for it.  We
  // know that the line isn't completely empty because it has the caret in it at
  // least.
  CaretLine.erase(CaretLine.find_last_not_of(' ')+1);

  printSourceLine(OS, LineContents);

  {
    WithColor S(OS, raw_ostream::GREEN, true, false, !ShowColors);

    // Print out the caret line, matching tabs in the source line.
    for (unsigned i = 0, e = CaretLine.size(), OutCol = 0; i != e; ++i) {
      if (i >= LineContents.size() || LineContents[i] != '\t') {
        S << CaretLine[i];
        ++OutCol;
        continue;
      }

      // Okay, we have a tab.  Insert the appropriate number of characters.
      do {
        S << CaretLine[i];
        ++OutCol;
      } while ((OutCol % TabStop) != 0);
    }
    S << '\n';
  }

  // Print out the replacement line, matching tabs in the source line.
  if (FixItInsertionLine.empty())
    return;

  for (size_t i = 0, e = FixItInsertionLine.size(), OutCol = 0; i < e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      OS << FixItInsertionLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      OS << FixItInsertionLine[i];
      // FIXME: This is trying not to break up replacements, but then to re-sync
      // with the tabs between replacements. This will fail, though, if two
      // fix-it replacements are exactly adjacent, or if a fix-it contains a
      // space. Really we should be precomputing column widths, which we'll
      // need anyway for multibyte chars.
      if (FixItInsertionLine[i] != ' ')
        ++i;
      ++OutCol;
    } while (((OutCol % TabStop) != 0) && i != e);
  }
  OS << '\n';
}